

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  bool bVar1;
  undefined4 in_EDX;
  byte *in_RSI;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000664;
  bool *in_stack_00000668;
  char *in_stack_00000670;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar2;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc4;
  ImGuiWindow *str_end;
  ImGuiContext *pIVar3;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  str_end = GImGui->CurrentWindow;
  pIVar3 = GImGui;
  ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),&GImGui->Initialized,
                     (char *)str_end);
  bVar1 = IsPopupOpen((ImGuiID)in_stack_ffffffffffffffc4);
  if (bVar1) {
    if ((pIVar3->NextWindowData).PosCond == 0) {
      operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0.0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,0.5,0.5);
      SetNextWindowPos((ImVec2 *)&stack0xffffffffffffffc4,8,(ImVec2 *)&stack0xffffffffffffffbc);
    }
    local_1 = Begin(in_stack_00000670,in_stack_00000668,in_stack_00000664);
    uVar2 = (uint)local_1 << 0x18;
    if ((!local_1) || ((in_RSI != (byte *)0x0 && ((*in_RSI & 1) == 0)))) {
      EndPopup();
      if ((uVar2 & 0x1000000) != 0) {
        ClosePopupToLevel((int)((ulong)str_end >> 0x20),SUB81((ulong)str_end >> 0x18,0));
      }
      local_1 = false;
    }
  }
  else {
    ImGuiNextWindowData::Clear(&pIVar3->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if (g.NextWindowData.PosCond == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}